

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv4Transmitter::AddDestination(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  ushort uVar1;
  uint uVar2;
  RTPMemoryManager *pRVar3;
  HashElement *pHVar4;
  int iVar5;
  HashElement *pHVar6;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  
  iVar5 = -0x5a;
  if (((this->init == true) && (iVar5 = -0x59, this->created == true)) &&
     (iVar5 = -0x54, addr->addresstype == IPv4Address)) {
    uVar1 = *(ushort *)((long)&addr[1]._vptr_RTPAddress + 2);
    uVar2 = *(uint *)&addr->field_0xc;
    uVar8 = *(ushort *)&addr[1]._vptr_RTPAddress << 8 | *(ushort *)&addr[1]._vptr_RTPAddress >> 8;
    uVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar7 = uVar2 % 0x207d;
    for (pHVar6 = (this->destinations).table[uVar7]; pHVar6 != (HashElement *)0x0;
        pHVar6 = pHVar6->hashnext) {
      if (((pHVar6->element).rtpaddr.sin_addr.s_addr == uVar9) &&
         ((pHVar6->element).rtpaddr.sin_port == uVar8)) {
        return -4;
      }
    }
    pRVar3 = (this->destinations).super_RTPMemoryObject.mgr;
    if (pRVar3 == (RTPMemoryManager *)0x0) {
      pHVar6 = (HashElement *)operator_new(0x48);
    }
    else {
      pHVar6 = (HashElement *)
               (**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,0x48,(this->destinations).memorytype);
    }
    (pHVar6->element).ip = uVar2;
    (pHVar6->element).rtpaddr.sin_family = 2;
    (pHVar6->element).rtpaddr.sin_port = uVar8;
    (pHVar6->element).rtpaddr.sin_addr.s_addr = uVar9;
    (pHVar6->element).rtpaddr.sin_zero[0] = '\0';
    (pHVar6->element).rtpaddr.sin_zero[1] = '\0';
    (pHVar6->element).rtpaddr.sin_zero[2] = '\0';
    (pHVar6->element).rtpaddr.sin_zero[3] = '\0';
    (pHVar6->element).rtpaddr.sin_zero[4] = '\0';
    (pHVar6->element).rtpaddr.sin_zero[5] = '\0';
    (pHVar6->element).rtpaddr.sin_zero[6] = '\0';
    (pHVar6->element).rtpaddr.sin_zero[7] = '\0';
    (pHVar6->element).rtcpaddr.sin_family = 2;
    (pHVar6->element).rtcpaddr.sin_port = uVar1 << 8 | uVar1 >> 8;
    (pHVar6->element).rtcpaddr.sin_addr.s_addr = uVar9;
    (pHVar6->element).rtcpaddr.sin_zero[0] = '\0';
    (pHVar6->element).rtcpaddr.sin_zero[1] = '\0';
    (pHVar6->element).rtcpaddr.sin_zero[2] = '\0';
    (pHVar6->element).rtcpaddr.sin_zero[3] = '\0';
    (pHVar6->element).rtcpaddr.sin_zero[4] = '\0';
    (pHVar6->element).rtcpaddr.sin_zero[5] = '\0';
    (pHVar6->element).rtcpaddr.sin_zero[6] = '\0';
    (pHVar6->element).rtcpaddr.sin_zero[7] = '\0';
    pHVar6->hashprev = (HashElement *)0x0;
    pHVar6->hashnext = (HashElement *)0x0;
    pHVar6->listprev = (HashElement *)0x0;
    pHVar6->listnext = (HashElement *)0x0;
    pHVar6->hashindex = uVar7;
    pHVar4 = (this->destinations).table[uVar7];
    (this->destinations).table[uVar7] = pHVar6;
    pHVar6->hashnext = pHVar4;
    if (pHVar4 != (HashElement *)0x0) {
      pHVar4->hashprev = pHVar6;
    }
    if ((this->destinations).firsthashelem == (HashElement *)0x0) {
      (this->destinations).firsthashelem = pHVar6;
    }
    else {
      pHVar4 = (this->destinations).lasthashelem;
      pHVar4->listnext = pHVar6;
      pHVar6->listprev = pHVar4;
    }
    (this->destinations).lasthashelem = pHVar6;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int RTPUDPv4Transmitter::AddDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}

	RTPIPv4Destination dest;
	if (!RTPIPv4Destination::AddressToDestination(addr, dest))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	int status = destinations.AddElement(dest);

	MAINMUTEX_UNLOCK
	return status;
}